

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlDebugDumpNode(FILE *output,xmlNodePtr node,int depth)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_a0;
  
  if (output == (FILE *)0x0) {
    output = _stdout;
  }
  local_a0.nodict = 0;
  local_a0.options = 0;
  local_a0.doc = (xmlDocPtr)0x0;
  local_a0.node = (xmlNodePtr)0x0;
  local_a0.dict = (xmlDictPtr)0x0;
  local_a0.check = 0;
  local_a0.errors = 0;
  builtin_strncpy(local_a0.shift,
                  "                                                                                                    "
                  ,0x65);
  local_a0.output = output;
  local_a0.depth = depth;
  xmlCtxtDumpNode(&local_a0,node);
  return;
}

Assistant:

void
xmlDebugDumpNode(FILE * output, xmlNodePtr node, int depth)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.depth = depth;
    xmlCtxtDumpNode(&ctxt, node);
    xmlCtxtDumpCleanCtxt(&ctxt);
}